

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void testDirectSelfSupertype(void)

{
  bool bVar1;
  int iVar2;
  HeapType other;
  char *pcVar3;
  char *in_R9;
  AssertHelper local_1a0;
  Message local_198;
  uint local_18c;
  undefined1 local_188 [8];
  AssertionResult gtest_ar_2;
  Message local_170;
  ErrorReason local_164;
  undefined1 local_160 [8];
  AssertionResult gtest_ar_1;
  Message local_148;
  ErrorReason local_13c;
  undefined1 local_138 [8];
  AssertionResult gtest_ar;
  string local_120;
  AssertHelper local_100;
  Message local_f8;
  undefined1 local_f0 [8];
  AssertionResult gtest_ar__1;
  Error *error;
  AssertHelper local_b8;
  Message local_b0;
  bool local_a1;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_;
  BuildResult result;
  Entry local_58 [2];
  Entry local_38;
  Struct local_28;
  TypeBuilder local_10;
  TypeBuilder builder;
  
  wasm::TypeBuilder::TypeBuilder(&local_10,1);
  local_28.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_28.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_28.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_28);
  local_38 = wasm::TypeBuilder::operator[](&local_10,0);
  wasm::TypeBuilder::Entry::operator=(&local_38,&local_28);
  wasm::Struct::~Struct(&local_28);
  local_58[0] = wasm::TypeBuilder::operator[](&local_10,0);
  join_0x00000010_0x00000000_ = wasm::TypeBuilder::operator[](&local_10,0);
  other = wasm::TypeBuilder::Entry::operator_cast_to_HeapType
                    ((Entry *)((long)&result.
                                      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                      .
                                      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              + 0x18));
  wasm::TypeBuilder::Entry::subTypeOf(local_58,other);
  wasm::TypeBuilder::build();
  bVar1 = wasm::TypeBuilder::BuildResult::operator_cast_to_bool((BuildResult *)&gtest_ar_.message_);
  local_a1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_a0,&local_a1,(type *)0x0)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&error,(internal *)local_a0,(AssertionResult *)"result","true","false",
               in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0xd9,pcVar3);
    testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    std::__cxx11::string::~string((string *)&error);
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )wasm::TypeBuilder::BuildResult::getError((BuildResult *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::Error_const*>
            ((AssertionResult *)local_f0,(Error **)&gtest_ar__1.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f0);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_120,(internal *)local_f0,(AssertionResult *)"error","false","true",in_R9);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_100,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0xdc,pcVar3);
    testing::internal::AssertHelper::operator=(&local_100,&local_f8);
    testing::internal::AssertHelper::~AssertHelper(&local_100);
    std::__cxx11::string::~string((string *)&local_120);
    testing::Message::~Message(&local_f8);
  }
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f0);
  if (gtest_ar.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    iVar2 = wasm::getTypeSystem();
    if (iVar2 == 1) {
      local_13c = SelfSupertype;
      testing::internal::EqHelper::
      Compare<wasm::TypeBuilder::ErrorReason,_wasm::TypeBuilder::ErrorReason,_nullptr>
                ((EqHelper *)local_138,"error->reason","TypeBuilder::ErrorReason::SelfSupertype",
                 (ErrorReason *)
                 ((long)gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl + 8),&local_13c);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
      if (!bVar1) {
        testing::Message::Message(&local_148);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0xde,pcVar3);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_148);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
        testing::Message::~Message(&local_148);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
    }
    else {
      iVar2 = wasm::getTypeSystem();
      if (iVar2 == 0) {
        local_164 = ForwardSupertypeReference;
        testing::internal::EqHelper::
        Compare<wasm::TypeBuilder::ErrorReason,_wasm::TypeBuilder::ErrorReason,_nullptr>
                  ((EqHelper *)local_160,"error->reason",
                   "TypeBuilder::ErrorReason::ForwardSupertypeReference",
                   (ErrorReason *)
                   ((long)gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl + 8),&local_164);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_160);
        if (!bVar1) {
          testing::Message::Message(&local_170);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_160);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0xe1,pcVar3);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_2.message_,&local_170);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
          testing::Message::~Message(&local_170);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_160);
      }
    }
    local_18c = 0;
    testing::internal::EqHelper::Compare<unsigned_long,_unsigned_int,_nullptr>
              ((EqHelper *)local_188,"error->index","0u",
               (unsigned_long *)
               gtest_ar__1.message_._M_t.
               super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_t.
               super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               .
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               ._M_head_impl,&local_18c);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_188);
    if (!bVar1) {
      testing::Message::Message(&local_198);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_188);
      testing::internal::AssertHelper::AssertHelper
                (&local_1a0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0xe3,pcVar3);
      testing::internal::AssertHelper::operator=(&local_1a0,&local_198);
      testing::internal::AssertHelper::~AssertHelper(&local_1a0);
      testing::Message::~Message(&local_198);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_188);
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_4_ = 0;
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_10);
  return;
}

Assistant:

static void testDirectSelfSupertype() {
  // Type is directly a supertype of itself.
  TypeBuilder builder(1);
  builder[0] = Struct{};
  builder[0].subTypeOf(builder[0]);

  auto result = builder.build();
  EXPECT_FALSE(result);

  const auto* error = result.getError();
  ASSERT_TRUE(error);
  if (getTypeSystem() == TypeSystem::Nominal) {
    EXPECT_EQ(error->reason, TypeBuilder::ErrorReason::SelfSupertype);
  } else if (getTypeSystem() == TypeSystem::Isorecursive) {
    EXPECT_EQ(error->reason,
              TypeBuilder::ErrorReason::ForwardSupertypeReference);
  }
  EXPECT_EQ(error->index, 0u);
}